

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::RepeatedFieldHelper<18>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  long *ptr;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  RepeatedField<long> *array;
  int index;
  
  if (0 < *field) {
    index = 0;
    do {
      uVar5 = md->tag;
      pbVar2 = output->ptr;
      if (uVar5 < 0x80) {
        *pbVar2 = (byte)uVar5;
        pbVar2 = pbVar2 + 1;
      }
      else {
        *pbVar2 = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          pbVar2[1] = (byte)(uVar5 >> 7);
          pbVar2 = pbVar2 + 2;
        }
        else {
          pbVar2 = pbVar2 + 2;
          uVar5 = uVar5 >> 7;
          do {
            pbVar3 = pbVar2;
            pbVar3[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            pbVar2 = pbVar3 + 1;
            bVar1 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar1);
          *pbVar3 = (byte)uVar6;
        }
      }
      output->ptr = pbVar2;
      ptr = RepeatedField<long>::Get((RepeatedField<long> *)field,index);
      puVar4 = PrimitiveTypeHelper<18>::SerializeToArray(ptr,output->ptr);
      output->ptr = puVar4;
      index = index + 1;
    } while (index < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }